

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O1

uint __thiscall Executor::calculateRank(Executor *this,Values *values)

{
  pointer puVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  
  puVar1 = (values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(values->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar3 != 0) {
    uVar4 = 0;
    uVar2 = 0;
    do {
      iVar5 = puVar1[uVar4] -
              (this->m_desired).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar4];
      iVar6 = -iVar5;
      if (0 < iVar5) {
        iVar6 = iVar5;
      }
      uVar2 = uVar2 + iVar6;
      uVar4 = uVar4 + 1;
    } while ((uVar4 & 0xffffffff) < (ulong)(lVar3 >> 2));
    return uVar2;
  }
  return 0;
}

Assistant:

unsigned int Executor::calculateRank(const Values& values) const noexcept
{
    unsigned int rank = 0u;

    for (unsigned int i = 0; i < values.size(); i++)
    {
        const int a = values[i] - m_desired[i];
        rank += std::abs(a);
    }

    return rank;
}